

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_airshield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_airshield);
  if (bVar1) {
    txt = "You are already surrounded by a shield of air.\n\r";
  }
  else {
    if (ch->in_room->sector_type != 8) {
      init_affect(&af);
      af.where = 0;
      af.aftype = 0;
      af.type = gsn_airshield;
      af.level = (short)level;
      af.duration = (short)(level / 4);
      af.location = 0;
      af.modifier = 0;
      af.mod_name = 8;
      affect_to_char(ch,&af);
      send_to_char("The air begins to swirl rapidly around you.\n\r",ch);
      act("$n raises $s arms, and swirling winds surround $m.",ch,(void *)0x0,(void *)0x0,0);
      return;
    }
    txt = "You can\'t cast that here.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_airshield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_airshield))
	{
		send_to_char("You are already surrounded by a shield of air.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You can't cast that here.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_airshield;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 4;
	af.location = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("The air begins to swirl rapidly around you.\n\r", ch);
	act("$n raises $s arms, and swirling winds surround $m.", ch, 0, 0, TO_ROOM);
}